

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O0

void dmrC_kill_insn(dmr_C *C,instruction *insn,int force)

{
  int force_local;
  instruction *insn_local;
  dmr_C *C_local;
  
  if ((insn != (instruction *)0x0) && (insn->bb != (basic_block *)0x0)) {
    switch(*(undefined1 *)insn) {
    case 1:
      return;
    case 3:
    default:
      break;
    case 4:
    case 7:
      dmrC_kill_use(C,&(insn->field_5).target);
      break;
    case 0x25:
    case 0x3f:
      dmrC_kill_use(C,&(insn->field_6).field_6.src3);
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x20:
    case 0x21:
    case 0x22:
      dmrC_kill_use(C,&(insn->field_6).field_6.src2);
    case 0x23:
    case 0x24:
    case 0x2b:
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x38:
      dmrC_kill_use(C,(pseudo_t *)&(insn->field_6).field_0);
      break;
    case 0x29:
      if ((force == 0) && (((insn->type->field_14).field_2.ctype.modifiers & 0x20) != 0)) {
        return;
      }
      dmrC_kill_use(C,(pseudo_t *)&(insn->field_6).field_0);
      break;
    case 0x2a:
      if (force == 0) {
        return;
      }
      dmrC_kill_use(C,(pseudo_t *)&(insn->field_6).field_0);
      dmrC_kill_use(C,&(insn->field_5).target);
      break;
    case 0x2c:
      C->L->repeat_phase = C->L->repeat_phase | 2;
      break;
    case 0x2e:
      kill_use_list(C,(pseudo_list *)(insn->field_6).field_1.bb_true);
      break;
    case 0x2f:
      dmrC_kill_use(C,(pseudo_t *)&(insn->field_6).field_0);
      break;
    case 0x35:
      if (force == 0) {
        if (((insn->field_6).field_4.phi_src)->type != PSEUDO_SYM) {
          return;
        }
        if (((ulong)((insn->field_6).field_1.bb_true)->parents->list_[8] & 0x2000) == 0) {
          return;
        }
      }
      kill_use_list(C,(insn->field_6).field_9.arguments);
      if (((insn->field_6).field_4.phi_src)->type == PSEUDO_REG) {
        dmrC_kill_use(C,(pseudo_t *)&(insn->field_6).field_0);
      }
    }
    insn->bb = (basic_block *)0x0;
    C->L->repeat_phase = C->L->repeat_phase | 1;
  }
  return;
}

Assistant:

void dmrC_kill_insn(struct dmr_C *C, struct instruction *insn, int force)
{
	if (!insn || !insn->bb)
		return;

	switch (insn->opcode) {
	case OP_SEL:
	case OP_RANGE:
		dmrC_kill_use(C, &insn->src3);
		/* fall through */

	case OP_ADD:
	case OP_SUB:
	case OP_MULU: 
	case OP_MULS:
	case OP_DIVU: 
	case OP_DIVS:
	case OP_MODU: 
	case OP_MODS:
	case OP_SHL:
	case OP_LSR: 
	case OP_ASR:

		/* Logical */
	case OP_AND:
	case OP_OR:
	case OP_XOR:
	case OP_AND_BOOL:
	case OP_OR_BOOL:

	case OP_SET_EQ:
	case OP_SET_NE:
	case OP_SET_LE:
	case OP_SET_GE:
	case OP_SET_LT:
	case OP_SET_GT:
	case OP_SET_B:
	case OP_SET_A:
	case OP_SET_BE:
	case OP_SET_AE:
		dmrC_kill_use(C, &insn->src2);
		/* fall through */

	case OP_CAST:
	case OP_SCAST:
	case OP_FPCAST:
	case OP_PTRCAST:
	case OP_SETVAL:
	case OP_NOT: case OP_NEG:
	case OP_SLICE:
		dmrC_kill_use(C, &insn->src1);
		break;

	case OP_PHI:
		kill_use_list(C, insn->phi_list);
		break;
	case OP_PHISOURCE:
		dmrC_kill_use(C, &insn->phi_src);
		break;

	case OP_SYMADDR:
		C->L->repeat_phase |= REPEAT_SYMBOL_CLEANUP;
		break;

	case OP_CBR:
		/* fall through */
	case OP_COMPUTEDGOTO:
		dmrC_kill_use(C, &insn->cond);
		break;

	case OP_CALL:
		if (!force) {
			/* a "pure" function can be killed too */
			if (!(insn->func->type == PSEUDO_SYM))
				return;
			if (!(insn->func->sym->ctype.modifiers & MOD_PURE))
				return;
		}
		kill_use_list(C, insn->arguments);
		if (insn->func->type == PSEUDO_REG)
			dmrC_kill_use(C, &insn->func);
		break;

	case OP_LOAD:
		if (!force && insn->type->ctype.modifiers & MOD_VOLATILE)
			return;
		dmrC_kill_use(C, &insn->src);
		break;

	case OP_STORE:
		if (!force)
			return;
		dmrC_kill_use(C, &insn->src);
		dmrC_kill_use(C, &insn->target);
		break;

	case OP_ENTRY:
		/* ignore */
		return;

	case OP_BR:
	default:
		break;
	}

	insn->bb = NULL;
	C->L->repeat_phase |= REPEAT_CSE;
	return;
}